

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

char * __thiscall bloaty::Options::_InternalParse(Options *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  MessageFactory *pMVar2;
  DescriptorPool *pDVar3;
  uint64 uVar4;
  ParseContext *pPVar5;
  EpsCopyInputStream *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint64 val_1;
  uint64 val;
  uint32 tag;
  HasBits has_bits;
  EpsCopyInputStream *in_stack_ffffffffffffff98;
  Options *in_stack_ffffffffffffffa0;
  ParseContext *in_stack_ffffffffffffffa8;
  Options *in_stack_ffffffffffffffc0;
  Options *pOVar6;
  ParseContext *in_stack_ffffffffffffffc8;
  uint local_30;
  HasBits local_2c;
  EpsCopyInputStream *local_28;
  char *local_20;
  HasBits *local_10;
  HasBits *local_8;
  
  local_10 = &local_2c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_8 = local_10;
  memset(local_10,0,4);
LAB_001c4fe2:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done
                      ((ParseContext *)in_stack_ffffffffffffffa0,
                       &in_stack_ffffffffffffff98->limit_end_);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001c5856;
    local_20 = google::protobuf::internal::ReadTag
                         ((char *)in_stack_ffffffffffffffc8,(uint32 *)in_stack_ffffffffffffffc0,
                          (uint32)((ulong)in_RDI >> 0x20));
    if (local_20 == (char *)0x0) goto LAB_001c5873;
    pPVar5 = (ParseContext *)(ulong)((local_30 >> 3) - 1);
    switch(pPVar5) {
    case (ParseContext *)0x0:
      if ((local_30 & 0xff) == 10) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_filename_abi_cxx11_((Options *)0x1c5096);
          local_20 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               ((string *)in_stack_ffffffffffffffc0,(char *)in_RDI,pPVar5,
                                (char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_001c5873;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable(local_28,local_20);
        } while ((bVar1) && (bVar1 = google::protobuf::internal::ExpectTag<10u>(local_20), bVar1));
        goto LAB_001c4fe2;
      }
      break;
    case (ParseContext *)0x1:
      if ((local_30 & 0xff) == 0x12) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_base_filename_abi_cxx11_((Options *)0x1c513b);
          local_20 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               ((string *)in_stack_ffffffffffffffc0,(char *)in_RDI,pPVar5,
                                (char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_001c5873;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable(local_28,local_20);
        } while ((bVar1) && (bVar1 = google::protobuf::internal::ExpectTag<18u>(local_20), bVar1));
        goto LAB_001c4fe2;
      }
      break;
    case (ParseContext *)0x2:
      if ((local_30 & 0xff) == 0x1a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_data_source_abi_cxx11_((Options *)0x1c51e0);
          local_20 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               ((string *)in_stack_ffffffffffffffc0,(char *)in_RDI,pPVar5,
                                (char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_001c5873;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable(local_28,local_20);
        } while ((bVar1) && (bVar1 = google::protobuf::internal::ExpectTag<26u>(local_20), bVar1));
        goto LAB_001c4fe2;
      }
      break;
    case (ParseContext *)0x3:
      if ((local_30 & 0xff) != 0x20) break;
      _Internal::set_has_max_rows_per_level(&local_2c);
      pMVar2 = (MessageFactory *)
               google::protobuf::internal::ReadVarint((char **)in_stack_ffffffffffffffa0);
      in_RDI[1].data_.factory = pMVar2;
      goto joined_r0x001c573f;
    case (ParseContext *)0x4:
      if ((local_30 & 0xff) == 0x28) {
        in_stack_ffffffffffffffc8 =
             (ParseContext *)
             google::protobuf::internal::ReadVarint((char **)in_stack_ffffffffffffffa0);
        if (local_20 == (char *)0x0) goto LAB_001c5873;
        bVar1 = Options_Demangle_IsValid((int)in_stack_ffffffffffffffc8);
        if (bVar1) {
          _internal_set_demangle
                    (in_stack_ffffffffffffffa0,
                     (Options_Demangle)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        }
        else {
          pPVar5 = in_stack_ffffffffffffffc8;
          mutable_unknown_fields(in_stack_ffffffffffffffa0);
          google::protobuf::internal::WriteVarint
                    ((uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     (uint64)in_stack_ffffffffffffff98,(UnknownFieldSet *)0x1c532c);
          in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffc8;
          in_stack_ffffffffffffffc8 = pPVar5;
        }
        goto LAB_001c4fe2;
      }
      break;
    case (ParseContext *)0x5:
      if ((local_30 & 0xff) == 0x30) {
        in_stack_ffffffffffffffc0 =
             (Options *)google::protobuf::internal::ReadVarint((char **)in_stack_ffffffffffffffa0);
        if (local_20 == (char *)0x0) goto LAB_001c5873;
        bVar1 = Options_SortBy_IsValid((int)in_stack_ffffffffffffffc0);
        if (bVar1) {
          _internal_set_sort_by
                    (in_stack_ffffffffffffffa0,
                     (Options_SortBy)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        }
        else {
          pOVar6 = in_stack_ffffffffffffffc0;
          mutable_unknown_fields(in_stack_ffffffffffffffc0);
          google::protobuf::internal::WriteVarint
                    ((uint32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                     (uint64)in_stack_ffffffffffffff98,(UnknownFieldSet *)0x1c53c3);
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffc0;
          in_stack_ffffffffffffffc0 = pOVar6;
        }
        goto LAB_001c4fe2;
      }
      break;
    case (ParseContext *)0x6:
      if ((local_30 & 0xff) == 0x38) {
        _Internal::set_has_verbose_level(&local_2c);
        uVar4 = google::protobuf::internal::ReadVarint((char **)in_stack_ffffffffffffffa0);
        in_RDI[1].super_EpsCopyInputStream.last_tag_minus_1_ = (uint32)uVar4;
        goto joined_r0x001c573f;
      }
      break;
    case (ParseContext *)0x7:
      if ((local_30 & 0xff) == 0x42) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff98 = local_28;
          _internal_add_custom_data_source((Options *)0x1c5473);
          local_20 = google::protobuf::internal::ParseContext::
                     ParseMessage<bloaty::CustomDataSource>
                               (in_RDI,(CustomDataSource *)pPVar5,(char *)in_stack_ffffffffffffffa8)
          ;
          if (local_20 == (char *)0x0) goto LAB_001c5873;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable(local_28,local_20);
        } while ((bVar1) && (bVar1 = google::protobuf::internal::ExpectTag<66u>(local_20), bVar1));
        goto LAB_001c4fe2;
      }
      break;
    case (ParseContext *)0x8:
      if ((local_30 & 0xff) == 0x4a) {
        _internal_mutable_disassemble_function_abi_cxx11_(in_stack_ffffffffffffffa0);
        local_20 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffc0,(char *)in_RDI,pPVar5,
                              (char *)in_stack_ffffffffffffffa8);
        goto joined_r0x001c573f;
      }
      break;
    case (ParseContext *)0x9:
      if ((local_30 & 0xff) == 0x52) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_debug_filename_abi_cxx11_((Options *)0x1c5571);
          local_20 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               ((string *)in_stack_ffffffffffffffc0,(char *)in_RDI,pPVar5,
                                (char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_001c5873;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable(local_28,local_20);
        } while ((bVar1) && (bVar1 = google::protobuf::internal::ExpectTag<82u>(local_20), bVar1));
        goto LAB_001c4fe2;
      }
      break;
    case (ParseContext *)0xa:
      if ((local_30 & 0xff) == 0x58) {
        _Internal::set_has_debug_vmaddr(&local_2c);
        uVar4 = google::protobuf::internal::ReadVarint((char **)in_stack_ffffffffffffffa0);
        in_RDI[1].depth_ = (int)uVar4;
        in_RDI[1].group_depth_ = (int)(uVar4 >> 0x20);
        goto joined_r0x001c573f;
      }
      break;
    case (ParseContext *)0xb:
      if ((local_30 & 0xff) == 0x60) {
        _Internal::set_has_debug_fileoff(&local_2c);
        pDVar3 = (DescriptorPool *)
                 google::protobuf::internal::ReadVarint((char **)in_stack_ffffffffffffffa0);
        in_RDI[1].data_.pool = pDVar3;
        goto joined_r0x001c573f;
      }
      break;
    case (ParseContext *)0xc:
      if ((local_30 & 0xff) == 0x6a) {
        _internal_mutable_source_filter_abi_cxx11_(in_stack_ffffffffffffffa0);
        local_20 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffc0,(char *)in_RDI,pPVar5,
                              (char *)in_stack_ffffffffffffffa8);
        goto joined_r0x001c573f;
      }
      break;
    case (ParseContext *)0xd:
      if ((local_30 & 0xff) == 0x70) {
        _Internal::set_has_dump_raw_map(&local_2c);
        uVar4 = google::protobuf::internal::ReadVarint((char **)in_stack_ffffffffffffffa0);
        *(bool *)&in_RDI[1].super_EpsCopyInputStream.overall_limit_ = uVar4 != 0;
        goto joined_r0x001c573f;
      }
      break;
    case (ParseContext *)0xe:
      if ((local_30 & 0xff) == 0x7a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_source_map_abi_cxx11_((Options *)0x1c5794);
          local_20 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               ((string *)in_stack_ffffffffffffffc0,(char *)in_RDI,pPVar5,
                                (char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_001c5873;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable(local_28,local_20);
        } while ((bVar1) && (bVar1 = google::protobuf::internal::ExpectTag<122u>(local_20), bVar1));
        goto LAB_001c4fe2;
      }
    }
    if (((local_30 & 7) == 4) || (local_30 == 0)) {
      google::protobuf::internal::EpsCopyInputStream::SetLastTag(local_28,local_30);
      goto LAB_001c5856;
    }
    local_20 = google::protobuf::internal::UnknownFieldParse
                         ((uint32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (InternalMetadataWithArena *)in_RDI,(char *)pPVar5,
                          in_stack_ffffffffffffffa8);
joined_r0x001c573f:
    if (local_20 == (char *)0x0) {
LAB_001c5873:
      local_20 = (char *)0x0;
LAB_001c5856:
      google::protobuf::internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,&local_2c);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* Options::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string filename = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_filename(), ptr, ctx, "bloaty.Options.filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string base_filename = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_base_filename(), ptr, ctx, "bloaty.Options.base_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string data_source = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_data_source(), ptr, ctx, "bloaty.Options.data_source");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // optional int64 max_rows_per_level = 4 [default = 20];
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_max_rows_per_level(&has_bits);
          max_rows_per_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_Demangle_IsValid(val))) {
            _internal_set_demangle(static_cast<::bloaty::Options_Demangle>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_SortBy_IsValid(val))) {
            _internal_set_sort_by(static_cast<::bloaty::Options_SortBy>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional int32 verbose_level = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          _Internal::set_has_verbose_level(&has_bits);
          verbose_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.CustomDataSource custom_data_source = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_custom_data_source(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string disassemble_function = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_disassemble_function(), ptr, ctx, "bloaty.Options.disassemble_function");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string debug_filename = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_debug_filename(), ptr, ctx, "bloaty.Options.debug_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_vmaddr = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          _Internal::set_has_debug_vmaddr(&has_bits);
          debug_vmaddr_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_fileoff = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 96)) {
          _Internal::set_has_debug_fileoff(&has_bits);
          debug_fileoff_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_filter = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_filter(), ptr, ctx, "bloaty.Options.source_filter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool dump_raw_map = 14;
      case 14:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 112)) {
          _Internal::set_has_dump_raw_map(&has_bits);
          dump_raw_map_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string source_map = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_source_map(), ptr, ctx, "bloaty.Options.source_map");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}